

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::
parse_format_string<false,char,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>&>
          (detail *this,basic_string_view<char> format_str,
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
          *handler)

{
  detail *end;
  ulong uVar1;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *pfVar2;
  size_t sVar3;
  id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_&,_char>
  in_RAX;
  detail *pdVar4;
  void *pvVar5;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *this_00;
  char *unaff_RBX;
  detail *end_00;
  detail *pdVar6;
  detail *this_01;
  buffer<char> *c;
  
  this_00 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
             *)format_str.size_;
  if (format_str.data_ != (char *)0x0) {
    end_00 = (detail *)(format_str.data_ + (long)this);
    pdVar6 = this;
    do {
      pdVar4 = pdVar6;
      if (*pdVar6 != (detail)0x7b) {
        this = pdVar6 + 1;
        if ((long)end_00 - (long)this < 0) goto LAB_00107d39;
        pdVar4 = (detail *)memchr(this,0x7b,(long)end_00 - (long)this);
        if (pdVar4 == (detail *)0x0) goto joined_r0x00107cfa;
      }
      if (pdVar6 != pdVar4) {
        while( true ) {
          if ((long)pdVar4 - (long)pdVar6 < 0) goto LAB_00107d39;
          this_01 = pdVar6;
          pvVar5 = memchr(pdVar6,0x7d,(long)pdVar4 - (long)pdVar6);
          if (pvVar5 == (void *)0x0) break;
          end = (detail *)((long)pvVar5 + 1);
          if ((end == pdVar4) || (*end != (detail)0x7d)) goto LAB_00107d6e;
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
          ::on_text(this_00,(char *)pdVar6,(char *)end);
          pdVar6 = (detail *)((long)pvVar5 + 2);
        }
        this = (detail *)this_00;
        format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
        ::on_text(this_00,(char *)pdVar6,(char *)pdVar4);
      }
      pdVar4 = pdVar4 + 1;
      if (pdVar4 == end_00) {
        error_handler::on_error((error_handler *)this,"invalid format string");
      }
      if (*pdVar4 == (detail)0x7b) {
        pfVar2 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                  *)(this_00->context).out_.container;
        sVar3 = (pfVar2->parse_context).format_str_.size_;
        uVar1 = sVar3 + 1;
        if (*(ulong *)&(pfVar2->parse_context).next_arg_id_ < uVar1) {
          this = (detail *)pfVar2;
          (*(code *)**(undefined8 **)&pfVar2->field_0x0)(pfVar2,uVar1);
        }
        (pfVar2->parse_context).format_str_.size_ = uVar1;
        *(detail *)((pfVar2->parse_context).format_str_.data_ + sVar3) = *pdVar4;
        (this_00->context).out_.container = (buffer<char> *)pfVar2;
      }
      else {
        if (*pdVar4 == (detail)0x7d) {
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
          ::on_arg_id(this_00);
          pdVar6 = pdVar4;
        }
        else {
          in_RAX.handler = this_00;
          pdVar6 = (detail *)
                   parse_arg_id<char,fmt::v6::detail::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>&,char>>
                             ((char *)pdVar4,(char *)end_00,
                              (id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_&,_char>
                               *)&stack0xffffffffffffffc8);
          if (pdVar6 == end_00) {
LAB_00107d86:
            error_handler::on_error((error_handler *)pdVar4,"missing \'}\' in format string");
          }
          if (*pdVar6 == (detail)0x3a) {
            this = (detail *)this_00;
            pdVar4 = (detail *)
                     format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                     ::on_format_specs(this_00,(char *)(pdVar6 + 1),(char *)end_00);
            if ((pdVar4 == end_00) || (*pdVar4 != (detail)0x7d)) {
              error_handler::on_error((error_handler *)this,"unknown format specifier");
            }
            goto LAB_00107ce3;
          }
          if (*pdVar6 != (detail)0x7d) goto LAB_00107d86;
        }
        pdVar4 = pdVar6;
        this = (detail *)this_00;
        format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
        ::on_replacement_field(this_00,(char *)pdVar4);
      }
LAB_00107ce3:
      pdVar6 = pdVar4 + 1;
    } while (pdVar6 != end_00);
  }
  return;
joined_r0x00107cfa:
  while (-1 < (long)end_00 - (long)pdVar6) {
    this_01 = pdVar6;
    pvVar5 = memchr(pdVar6,0x7d,(long)end_00 - (long)pdVar6);
    if (pvVar5 == (void *)0x0) {
      format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
      ::on_text(this_00,(char *)pdVar6,(char *)end_00);
      return;
    }
    pdVar4 = (detail *)((long)pvVar5 + 1);
    if ((pdVar4 == end_00) || (*pdVar4 != (detail)0x7d)) {
LAB_00107d6e:
      error_handler::on_error((error_handler *)this_01,"unmatched \'}\' in format string");
    }
    format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
    ::on_text(this_00,(char *)pdVar6,(char *)pdVar4);
    pdVar6 = (detail *)((long)pvVar5 + 2);
  }
LAB_00107d39:
  assert_fail(unaff_RBX,0,(char *)in_RAX.handler);
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> format_str,
                                       Handler&& handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char* begin, const Char* end) {
      if (begin == end) return;
      for (;;) {
        const Char* p = nullptr;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler& handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char* p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin + 1, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end) return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}